

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
wasm::read_file<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,wasm *this,string *filename,BinaryOption binary)

{
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  long lVar4;
  do_read_stdin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  string local_3b8 [8];
  ifstream infile;
  undefined1 local_1b0 [392];
  
  this_00 = (do_read_stdin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0xde38b8;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                          "-");
  if (bVar1) {
    do_read_stdin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(__return_storage_ptr__,this_00);
    return __return_storage_ptr__;
  }
  bVar1 = isDebugEnabled("file");
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Loading \'");
    poVar3 = std::operator<<(poVar3,(string *)this);
    std::operator<<(poVar3,"\'...\n");
  }
  std::ifstream::ifstream(local_3b8);
  Path::to_path((PathString *)local_1b0,(string *)this);
  std::ifstream::open(local_3b8,(_Ios_Openmode)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    Fatal::Fatal((Fatal *)local_1b0);
    std::operator<<((ostream *)(local_1b0 + 0x10),"Failed opening \'");
    std::operator<<((ostream *)(local_1b0 + 0x10),(string *)this);
    Fatal::operator<<((Fatal *)local_1b0,(char (*) [2])0xe7a322);
  }
  else {
    std::istream::seekg((long)local_3b8,_S_beg);
    lVar4 = std::istream::tellg();
    if (lVar4 != -1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)lVar4);
      if (lVar4 != 0) {
        std::istream::seekg(local_3b8,0,0);
        std::istream::read((char *)local_3b8,(long)(__return_storage_ptr__->_M_dataplus)._M_p);
        if ((int)filename == 1) {
          std::__cxx11::string::resize((ulong)__return_storage_ptr__);
        }
      }
      std::ifstream::~ifstream(local_3b8);
      return __return_storage_ptr__;
    }
    Fatal::Fatal((Fatal *)local_1b0);
    poVar3 = (ostream *)(local_1b0 + 0x10);
    std::operator<<(poVar3,"Failed opening \'");
    std::operator<<(poVar3,(string *)this);
    std::operator<<(poVar3,"\': Input file too large: ");
    std::ostream::_M_insert<long>((long)poVar3);
    Fatal::operator<<((Fatal *)local_1b0,(char (*) [39])" bytes. Try rebuilding in 64-bit mode.");
  }
  Fatal::~Fatal((Fatal *)local_1b0);
}

Assistant:

T wasm::read_file(const std::string& filename, Flags::BinaryOption binary) {
  if (filename == "-") {
    return do_read_stdin<T>{}();
  }
  BYN_TRACE("Loading '" << filename << "'...\n");
  std::ifstream infile;
  std::ios_base::openmode flags = std::ifstream::in;
  if (binary == Flags::Binary) {
    flags |= std::ifstream::binary;
  }
  infile.open(wasm::Path::to_path(filename), flags);
  if (!infile.is_open()) {
    Fatal() << "Failed opening '" << filename << "'";
  }
  infile.seekg(0, std::ios::end);
  std::streampos insize = infile.tellg();
  if (uint64_t(insize) >= std::numeric_limits<size_t>::max()) {
    // Building a 32-bit executable where size_t == 32 bits, we are not able to
    // create strings larger than 2^32 bytes in length, so must abort here.
    Fatal() << "Failed opening '" << filename
            << "': Input file too large: " << insize
            << " bytes. Try rebuilding in 64-bit mode.";
  }
  // Zero-initialize the string or vector with the expected size.
  T input(size_t(insize), '\0');
  if (size_t(insize) == 0) {
    return input;
  }
  infile.seekg(0);
  infile.read(&input[0], insize);
  if (binary == Flags::Text) {
    size_t chars = size_t(infile.gcount());
    // Truncate size to the number of ASCII characters actually read in text
    // mode (which is generally less than the number of bytes on Windows, if
    // \r\n line endings are present)
    input.resize(chars);
  }
  return input;
}